

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-xml-c.c
# Opt level: O3

void test_xml_parse_document_2(void)

{
  _Bool _Var1;
  int iVar2;
  uint8_t *puVar3;
  size_t length;
  xml_document *document;
  xml_node *pxVar4;
  xml_string *pxVar5;
  size_t sVar6;
  xml_node *node;
  xml_node *pxVar7;
  int in_R8D;
  int iVar8;
  
  puVar3 = (uint8_t *)calloc(0xb1,1);
  memcpy(puVar3,
         "<Parent>\n\t<Child>\n\t\tFirst content\n\t</Child>\n\t<This><Is>\n<A><Test>Content A</Test></A>\n<B><Test>Content B</Test></B>\n\t</Is></This>\n\t<Child>\n\t\tSecond content\n\t</Child>\n</Parent>\n"
         ,0xb1);
  length = strlen((char *)puVar3);
  document = xml_parse_document(puVar3,length);
  _assert_that(document != (xml_document *)0x0,"Could not parse document",
               "test_xml_parse_document_2",(char *)0xa4,in_R8D);
  pxVar4 = xml_document_root(document);
  pxVar5 = xml_node_name(pxVar4);
  _Var1 = string_equals(pxVar5,"Parent");
  _assert_that(_Var1,"root node name must be `Parent\'","test_xml_parse_document_2",(char *)0xa7,
               in_R8D);
  sVar6 = xml_node_children(pxVar4);
  _assert_that(sVar6 == 3,"root must have two children","test_xml_parse_document_2",(char *)0xa8,
               in_R8D);
  iVar8 = 0x103424;
  node = xml_easy_child(pxVar4,(uint8_t *)"This","Is","A","Test",0);
  _assert_that(node != (xml_node *)0x0,"Cannot find Parent/This/Is/A/Test",
               "test_xml_parse_document_2",(char *)0xab,iVar8);
  pxVar5 = xml_node_content(node);
  _Var1 = string_equals(pxVar5,"Content A");
  _assert_that(_Var1,"Content of Parent/This/Is/A/Test must be `Content A\'",
               "test_xml_parse_document_2",(char *)0xac,iVar8);
  iVar8 = 0x103424;
  pxVar7 = xml_easy_child(pxVar4,(uint8_t *)"This","Is","B","Test",0);
  _assert_that(pxVar7 != (xml_node *)0x0,"Cannot find Parent/This/Is/B/Test",
               "test_xml_parse_document_2",(char *)0xaf,iVar8);
  pxVar5 = xml_node_content(pxVar7);
  _Var1 = string_equals(pxVar5,"Content B");
  _assert_that(_Var1,"Content of Parent/This/Is/B/Test must be `Content B\'",
               "test_xml_parse_document_2",(char *)0xb0,iVar8);
  iVar8 = 0x103424;
  pxVar7 = xml_easy_child(pxVar4,(uint8_t *)"This","Is","C","Test",0);
  _assert_that(pxVar7 == (xml_node *)0x0,
               "Must not find Parent/This/Is/C/Test because no such path exists",
               "test_xml_parse_document_2",(char *)0xb3,iVar8);
  pxVar7 = xml_easy_child(pxVar4,(uint8_t *)"Child");
  _assert_that(pxVar7 == (xml_node *)0x0,
               "Parent/Child cannot be a valid expression, because there are two children named `Child\' in `Parent\'"
               ,"test_xml_parse_document_2",(char *)0xb6,iVar8);
  pxVar4 = xml_easy_child(pxVar4,(uint8_t *)"This","Is",0);
  puVar3 = xml_easy_name(pxVar4);
  _Var1 = false;
  if (*puVar3 == 'I') {
    if (puVar3[1] == 's') {
      _Var1 = puVar3[2] == '\0';
    }
    else {
      _Var1 = false;
    }
  }
  _assert_that(_Var1,"Name of Parent/This/Is must be `Is\'","test_xml_parse_document_2",(char *)0xb9
               ,iVar8);
  free(puVar3);
  puVar3 = xml_easy_content(node);
  iVar2 = strcmp((char *)puVar3,"Content A");
  _assert_that(iVar2 == 0,"Content of Parent/This/Is/A/Test must be `Content A\'",
               "test_xml_parse_document_2",(char *)0xbd,iVar8);
  free(puVar3);
  xml_document_free(document,true);
  return;
}

Assistant:

static void test_xml_parse_document_2() {
	SOURCE(source, ""
		"<Parent>\n"
		"\t<Child>\n"
		"\t\tFirst content\n"
		"\t</Child>\n"
		"\t<This><Is>\n"
			"<A><Test>Content A</Test></A>\n"
			"<B><Test>Content B</Test></B>\n"
		"\t</Is></This>\n"
		"\t<Child>\n"
		"\t\tSecond content\n"
		"\t</Child>\n"
		"</Parent>\n"
	);
	struct xml_document* document = xml_parse_document(source, strlen(source));
	assert_that(document, "Could not parse document");

	struct xml_node* root = xml_document_root(document);
	assert_that(string_equals(xml_node_name(root), "Parent"), "root node name must be `Parent'");
	assert_that(3 == xml_node_children(root), "root must have two children");

	struct xml_node* test_a = xml_easy_child(root, "This", "Is", "A", "Test", 0);
	assert_that(test_a, "Cannot find Parent/This/Is/A/Test");
	assert_that(string_equals(xml_node_content(test_a), "Content A"), "Content of Parent/This/Is/A/Test must be `Content A'");

	struct xml_node* test_b = xml_easy_child(root, "This", "Is", "B", "Test", 0);
	assert_that(test_b, "Cannot find Parent/This/Is/B/Test");
	assert_that(string_equals(xml_node_content(test_b), "Content B"), "Content of Parent/This/Is/B/Test must be `Content B'");

	struct xml_node* test_c = xml_easy_child(root, "This", "Is", "C", "Test", 0);
	assert_that(!test_c, "Must not find Parent/This/Is/C/Test because no such path exists");

	struct xml_node* must_be_null = xml_easy_child(root, "Child");
	assert_that(!must_be_null, "Parent/Child cannot be a valid expression, because there are two children named `Child' in `Parent'");

	uint8_t* name_is = xml_easy_name(xml_easy_child(root, "This", "Is", 0));
	assert_that(!strcmp(name_is, "Is"), "Name of Parent/This/Is must be `Is'");
	free(name_is);

	uint8_t* content_a = xml_easy_content(test_a);
	assert_that(!strcmp(content_a, "Content A"), "Content of Parent/This/Is/A/Test must be `Content A'");
	free(content_a);

	xml_document_free(document, true);
}